

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-utf8.c
# Opt level: O0

void test_bson_utf8_non_shortest(void)

{
  char *pcVar1;
  size_t sVar2;
  ulong uVar3;
  uint local_c;
  int i;
  
  local_c = 0;
  while( true ) {
    if (test_bson_utf8_non_shortest::tests[(int)local_c] == (char *)0x0) {
      local_c = 0;
      while( true ) {
        if (test_bson_utf8_non_shortest::valid_tests[(int)local_c] == (char *)0x0) {
          return;
        }
        pcVar1 = test_bson_utf8_non_shortest::valid_tests[(int)local_c];
        sVar2 = strlen(test_bson_utf8_non_shortest::valid_tests[(int)local_c]);
        uVar3 = bson_utf8_validate(pcVar1,sVar2,1);
        if ((uVar3 & 1) == 0) break;
        local_c = local_c + 1;
      }
      fprintf(_stderr,"non-shortest form failure, valid_tests %d\n",(ulong)local_c);
      fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-utf8.c"
              ,0xf0,"test_bson_utf8_non_shortest","false");
      abort();
    }
    pcVar1 = test_bson_utf8_non_shortest::tests[(int)local_c];
    sVar2 = strlen(test_bson_utf8_non_shortest::tests[(int)local_c]);
    uVar3 = bson_utf8_validate(pcVar1,sVar2,0);
    if ((uVar3 & 1) != 0) break;
    local_c = local_c + 1;
  }
  fprintf(_stderr,"non-shortest form failure, test %d\n",(ulong)local_c);
  fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-utf8.c",
          0xe9,"test_bson_utf8_non_shortest","false");
  abort();
}

Assistant:

static void
test_bson_utf8_non_shortest (void)
{
   static const char *tests[] = {
      "\xE0\x80\x80",     /* Non-shortest form representation of U+0000 */
      "\xF0\x80\x80\x80", /* Non-shortest form representation of U+0000 */

      "\xE0\x83\xBF",     /* Non-shortest form representation of U+00FF */
      "\xF0\x80\x83\xBF", /* Non-shortest form representation of U+00FF */

      "\xF0\x80\xA3\x80", /* Non-shortest form representation of U+08C0 */

      NULL};
   static const char *valid_tests[] = {
      "\xC0\x80", /* Non-shortest form representation of U+0000.
                   * This is how \0 should be encoded. Special casing
                   * to allow for use in things like strlen(). */

      NULL};
   int i;

   for (i = 0; tests[i]; i++) {
      if (bson_utf8_validate (tests[i], strlen (tests[i]), false)) {
         fprintf (stderr, "non-shortest form failure, test %d\n", i);
         BSON_ASSERT (false);
      }
   }

   for (i = 0; valid_tests[i]; i++) {
      if (!bson_utf8_validate (valid_tests[i], strlen (valid_tests[i]), true)) {
         fprintf (stderr, "non-shortest form failure, valid_tests %d\n", i);
         BSON_ASSERT (false);
      }
   }
}